

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::dht_get_peers(session_impl *this,sha1_hash *info_hash)

{
  dht_tracker *this_00;
  undefined8 uVar1;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_40._8_8_ = 0;
    local_40._M_unused._M_object = operator_new(0x28);
    *(code **)local_40._M_unused._0_8_ = anon_unknown_119::on_dht_get_peers;
    uVar1 = *(undefined8 *)((info_hash->m_number)._M_elems + 2);
    *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) =
         *(undefined8 *)(info_hash->m_number)._M_elems;
    *(undefined8 *)((long)local_40._M_unused._0_8_ + 0x10) = uVar1;
    *(uint *)((long)local_40._M_unused._0_8_ + 0x18) = (info_hash->m_number)._M_elems[4];
    *(alert_manager **)((long)local_40._M_unused._0_8_ + 0x20) = &this->m_alerts;
    local_28 = ::std::
               _Function_handler<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&),_std::_Bind<void_(*(std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>))(libtorrent::aux::alert_manager_&,_libtorrent::digest32<160L>,_const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>_>
               ::_M_invoke;
    local_30 = ::std::
               _Function_handler<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&),_std::_Bind<void_(*(std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>))(libtorrent::aux::alert_manager_&,_libtorrent::digest32<160L>,_const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>_>
               ::_M_manager;
    libtorrent::dht::dht_tracker::get_peers
              (this_00,info_hash,
               (function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}